

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64_t google::protobuf::internal::ThreadSafeArena::GetNextLifeCycleId(void)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  
  puVar1 = (uint64_t *)__tls_get_addr(&PTR_001b9f20);
  uVar2 = *puVar1;
  if ((char)uVar2 == '\0') {
    LOCK();
    UNLOCK();
    uVar2 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  *puVar1 = uVar2 + 1;
  return uVar2;
}

Assistant:

uint64_t ThreadSafeArena::GetNextLifeCycleId() {
  ThreadCache& tc = thread_cache();
  uint64_t id = tc.next_lifecycle_id;
  constexpr uint64_t kInc = ThreadCache::kPerThreadIds;
  if (PROTOBUF_PREDICT_FALSE((id & (kInc - 1)) == 0)) {
    // On platforms that don't support uint64_t atomics we can certainly not
    // afford to increment by large intervals and expect uniqueness due to
    // wrapping, hence we only add by 1.
    id = lifecycle_id_.fetch_add(1, std::memory_order_relaxed) * kInc;
  }
  tc.next_lifecycle_id = id + 1;
  return id;
}